

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall CP::list<int>::print(list<int> *this)

{
  node *pnVar1;
  ostream *poVar2;
  node *pnVar3;
  int iVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout," Size = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout," Header address = ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2," (prev = ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2," next = ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar4 = 0;
  pnVar3 = this->mHeader;
  pnVar1 = pnVar3;
  while (pnVar1 = pnVar1->next, pnVar3 != pnVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Node ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar4);
    poVar2 = std::operator<<(poVar2,": ");
    std::ostream::operator<<((ostream *)poVar2,pnVar1->data);
    poVar2 = std::operator<<((ostream *)&std::cout," (prev = ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,", I\'m at ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,", next = ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar4 = iVar4 + 1;
    pnVar3 = this->mHeader;
  }
  return;
}

Assistant:

void print() {
      std::cout << " Size = " << mSize << std::endl;
      std::cout << " Header address = " << (mHeader) << " (prev = " << mHeader->prev << " next = " << mHeader->next << ")" << std::endl;
      int i = 0;
      iterator before;
      for (iterator it = begin();it!=end();before = it, it++,i++) {
        std::cout << "Node " << i << ": " << *it;
        std::cout << " (prev = " << it.ptr->prev << ", I'm at " << it.ptr << ", next = " << it.ptr->next << ")" <<  std:: endl;
      }
    }